

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
 tonk::
 MakeUniqueNoThrow<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,asio::io_context&>
           (io_context *args)

{
  void *pvVar1;
  io_context *in_RDI;
  _Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
  this;
  
  this._M_head_impl =
       (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)in_RDI
  ;
  pvVar1 = operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
    basic_datagram_socket(this._M_head_impl,in_RDI);
  }
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,std::default_delete<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>>>
  ::
  unique_ptr<std::default_delete<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>>,void>
            ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              *)this._M_head_impl,(pointer)in_RDI);
  return (__uniq_ptr_data<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>,_true,_true>
          )(tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
            )this._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}